

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_foreach_event(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  int r;
  void *arg_local;
  event_base_foreach_event_cb fn_local;
  event_base *base_local;
  
  if ((fn == (event_base_foreach_event_cb)0x0) || (base == (event_base *)0x0)) {
    base_local._4_4_ = -1;
  }
  else {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    base_local._4_4_ = event_base_foreach_event_nolock_(base,fn,arg);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_foreach_event(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	int r;
	if ((!fn) || (!base)) {
		return -1;
	}
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	r = event_base_foreach_event_nolock_(base, fn, arg);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}